

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O2

int xmlThrDefPedanticParserDefaultValue(int v)

{
  int iVar1;
  
  xmlMutexLock(&xmlThrDefMutex);
  iVar1 = xmlPedanticParserDefaultValueThrDef;
  xmlPedanticParserDefaultValueThrDef = v;
  xmlMutexUnlock(&xmlThrDefMutex);
  return iVar1;
}

Assistant:

int xmlThrDefPedanticParserDefaultValue(int v) {
    int ret;
    xmlMutexLock(&xmlThrDefMutex);
    ret = xmlPedanticParserDefaultValueThrDef;
    xmlPedanticParserDefaultValueThrDef = v;
    xmlMutexUnlock(&xmlThrDefMutex);
    return ret;
}